

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.h
# Opt level: O0

void __thiscall
PerspectiveCamera::PerspectiveCamera
          (PerspectiveCamera *this,Vector3f *center,Vector3f *direction,Vector3f *up,
          float angleradians)

{
  Vector3f local_54;
  Vector3f local_48 [2];
  float local_2c;
  Vector3f *pVStack_28;
  float angleradians_local;
  Vector3f *up_local;
  Vector3f *direction_local;
  Vector3f *center_local;
  PerspectiveCamera *this_local;
  
  local_2c = angleradians;
  pVStack_28 = up;
  up_local = direction;
  direction_local = center;
  center_local = (Vector3f *)this;
  Camera::Camera(&this->super_Camera);
  (this->super_Camera)._vptr_Camera = (_func_int **)&PTR__PerspectiveCamera_00170ce0;
  Vector3f::Vector3f(&this->_center,direction_local);
  Vector3f::normalized(&this->_direction);
  Vector3f::Vector3f(&this->_up,pVStack_28);
  this->_angle = local_2c;
  Vector3f::Vector3f(&this->_horizontal,0.0);
  Vector3f::cross(&local_54,up_local,pVStack_28);
  Vector3f::normalized(local_48);
  Vector3f::operator=(&this->_horizontal,local_48);
  return;
}

Assistant:

PerspectiveCamera(const Vector3f &center,
                      const Vector3f &direction,
                      const Vector3f &up,
                      float angleradians) :
            _center(center),
            _direction(direction.normalized()),
            _up(up),
            _angle(angleradians) {
        _horizontal = Vector3f::cross(direction, up).normalized();
    }